

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_buffer_mark(nk_buffer *buffer,nk_buffer_allocation_type type)

{
  nk_buffer_allocation_type type_local;
  nk_buffer *buffer_local;
  
  if (buffer == (nk_buffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x1a1f,"void nk_buffer_mark(struct nk_buffer *, enum nk_buffer_allocation_type)")
    ;
  }
  if (buffer != (nk_buffer *)0x0) {
    buffer->marker[type].active = 1;
    if (type == NK_BUFFER_BACK) {
      buffer->marker[1].offset = buffer->size;
    }
    else {
      buffer->marker[type].offset = buffer->allocated;
    }
  }
  return;
}

Assistant:

NK_API void
nk_buffer_mark(struct nk_buffer *buffer, enum nk_buffer_allocation_type type)
{
    NK_ASSERT(buffer);
    if (!buffer) return;
    buffer->marker[type].active = nk_true;
    if (type == NK_BUFFER_BACK)
        buffer->marker[type].offset = buffer->size;
    else buffer->marker[type].offset = buffer->allocated;
}